

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenEnumArray(CppGenerator *this,EnumDef *enum_def)

{
  EnumVal *pEVar1;
  bool bVar2;
  size_t t;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  const_reference ppEVar5;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *local_f0;
  char *suffix;
  string value;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_b8;
  const_iterator it;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string num_fields;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  num_fields.field_2._8_8_ = enum_def;
  t = EnumDef::size(enum_def);
  NumToString<unsigned_long>((string *)local_38,t);
  std::operator+(&local_78,"inline const {{ENUM_NAME}} (&EnumValues{{ENUM_NAME}}())[",
                 (string *)local_38);
  std::operator+(&local_58,&local_78,"] {");
  CodeWriter::operator+=(&this->code_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"  static const {{ENUM_NAME}} values[] = {",
             (allocator<char> *)((long)&it._M_current + 7));
  CodeWriter::operator+=(&this->code_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  pvVar3 = EnumDef::Vals((EnumDef *)num_fields.field_2._8_8_);
  local_b8._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3);
  while( true ) {
    pvVar3 = EnumDef::Vals((EnumDef *)num_fields.field_2._8_8_);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3);
    bVar2 = __gnu_cxx::operator!=
                      (&local_b8,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar2) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_b8);
    value.field_2._8_8_ = *ppEVar4;
    GetEnumValUse_abi_cxx11_
              ((string *)&suffix,this,(EnumDef *)num_fields.field_2._8_8_,
               (EnumVal *)value.field_2._8_8_);
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_b8);
    pEVar1 = *ppEVar4;
    pvVar3 = EnumDef::Vals((EnumDef *)num_fields.field_2._8_8_);
    ppEVar5 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::back
                        (pvVar3);
    local_f0 = "";
    if (pEVar1 != *ppEVar5) {
      local_f0 = ",";
    }
    std::operator+(&local_130,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&suffix);
    std::operator+(&local_110,&local_130,local_f0);
    CodeWriter::operator+=(&this->code_,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&suffix);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"  };",&local_151);
  CodeWriter::operator+=(&this->code_,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"  return values;",&local_179);
  CodeWriter::operator+=(&this->code_,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"}",&local_1a1);
  CodeWriter::operator+=(&this->code_,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
  CodeWriter::operator+=(&this->code_,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenEnumArray(const EnumDef &enum_def) {
    auto num_fields = NumToString(enum_def.size());
    code_ += "inline const {{ENUM_NAME}} (&EnumValues{{ENUM_NAME}}())[" +
             num_fields + "] {";
    code_ += "  static const {{ENUM_NAME}} values[] = {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      auto value = GetEnumValUse(enum_def, ev);
      auto suffix = *it != enum_def.Vals().back() ? "," : "";
      code_ += "    " + value + suffix;
    }
    code_ += "  };";
    code_ += "  return values;";
    code_ += "}";
    code_ += "";
  }